

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::detail::generic_type::mark_parents_nonsimple(generic_type *this,PyTypeObject *value)

{
  bool bVar1;
  handle type;
  type_info *ptVar2;
  tuple t;
  iterator __end2;
  iterator __begin2;
  object local_60;
  iterator local_58;
  iterator local_38;
  
  local_60.super_handle.m_ptr = (handle)value->tp_bases;
  if (local_60.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_60.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_60.super_handle.m_ptr)->ob_refcnt + 1;
  }
  local_38.super_object.super_handle.m_ptr = (handle)PyObject_GetIter();
  local_38.ready = false;
  local_38.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_58.ready = false;
  local_58.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_58.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
  while( true ) {
    bVar1 = iterator::operator!=(&local_38,&local_58);
    if (!bVar1) break;
    type = iterator::operator*(&local_38);
    ptVar2 = get_type_info((PyTypeObject *)type.m_ptr);
    if (ptVar2 != (type_info *)0x0) {
      ptVar2->simple_type = false;
    }
    mark_parents_nonsimple(this,(PyTypeObject *)type.m_ptr);
    iterator::operator++(&local_38);
  }
  iterator::~iterator(&local_58);
  iterator::~iterator(&local_38);
  object::~object(&local_60);
  return;
}

Assistant:

void mark_parents_nonsimple(PyTypeObject *value) {
        auto t = reinterpret_borrow<tuple>(value->tp_bases);
        for (handle h : t) {
            auto tinfo2 = get_type_info((PyTypeObject *) h.ptr());
            if (tinfo2)
                tinfo2->simple_type = false;
            mark_parents_nonsimple((PyTypeObject *) h.ptr());
        }
    }